

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O3

void Abc_NtkFinalize(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkNew)

{
  long *plVar1;
  char *__s;
  Vec_Ptr_t *pVVar2;
  size_t sVar3;
  char *__dest;
  undefined8 *puVar4;
  long lVar5;
  
  pVVar2 = pNtk->vCos;
  if (0 < pVVar2->nSize) {
    lVar5 = 0;
    do {
      plVar1 = (long *)pVVar2->pArray[lVar5];
      puVar4 = *(undefined8 **)
                (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
      if (*(int *)*puVar4 == 1) {
        puVar4 = *(undefined8 **)
                  (*(long *)(*(long *)((int *)*puVar4 + 8) + 8) + (long)*(int *)puVar4[4] * 8);
      }
      Abc_ObjAddFanin((Abc_Obj_t *)plVar1[8],
                      (Abc_Obj_t *)((ulong)(*(uint *)((long)plVar1 + 0x14) >> 10 & 1) ^ puVar4[8]));
      lVar5 = lVar5 + 1;
      pVVar2 = pNtk->vCos;
    } while (lVar5 < pVVar2->nSize);
  }
  if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
    Abc_NtkTimeInitialize(pNtkNew,pNtk);
  }
  if (pNtk->vPhases != (Vec_Int_t *)0x0) {
    Abc_NtkTransferPhases(pNtkNew,pNtk);
  }
  __s = pNtk->pWLoadUsed;
  if (__s != (char *)0x0) {
    sVar3 = strlen(__s);
    __dest = (char *)malloc(sVar3 + 1);
    strcpy(__dest,__s);
    pNtkNew->pWLoadUsed = __dest;
  }
  return;
}

Assistant:

void Abc_NtkFinalize( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkNew )
{
    Abc_Obj_t * pObj, * pDriver, * pDriverNew;
    int i;
    // set the COs of the strashed network
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pDriver    = Abc_ObjFanin0Ntk( Abc_ObjFanin0(pObj) );
        pDriverNew = Abc_ObjNotCond(pDriver->pCopy, Abc_ObjFaninC0(pObj));
        Abc_ObjAddFanin( pObj->pCopy, pDriverNew );
    }
    // duplicate timing manager
    if ( pNtk->pManTime )
        Abc_NtkTimeInitialize( pNtkNew, pNtk );
    if ( pNtk->vPhases )
        Abc_NtkTransferPhases( pNtkNew, pNtk );
    if ( pNtk->pWLoadUsed )
        pNtkNew->pWLoadUsed = Abc_UtilStrsav( pNtk->pWLoadUsed );
}